

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

_Bool aa64_generate_debug_exceptions(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  uVar2 = (uint)uVar1;
  if ((uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar5 = uVar3 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar2 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar5)) goto LAB_00623885;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00623885:
  if (uVar3 == 3) {
    return false;
  }
  if ((uVar1 >> 0x21 & 1) != 0) {
    if ((((env->cp15).scr_el3 & 1) == 0) && (((env->cp15).mdcr_el3 & 0x10000) != 0)) {
      return false;
    }
    if ((uVar1 & 0x200000000) != 0) {
      if (env->aarch64 == 0) {
        bVar5 = (env->uncached_cpsr & 0x1f) == 0x16;
      }
      else {
        bVar5 = (~env->pstate & 0xc) == 0;
      }
      if (!bVar5) {
        bVar5 = ((env->cp15).scr_el3 & 1) == 0;
      }
      goto LAB_006238bb;
    }
  }
  bVar5 = false;
LAB_006238bb:
  if (((((uVar1 >> 0x20 & 1) == 0) || (bVar5)) ||
      ((uVar4 = 2, ((env->cp15).hcr_el2 & 0x8000000) == 0 && (((env->cp15).mdcr_el2 & 0x100) == 0)))
      ) && (((uVar1 & 0x200000000) == 0 || (uVar4 = 3, !(bool)((uVar2 >> 0x1c & 1) == 0 & bVar5)))))
  {
    uVar4 = 1;
  }
  if (uVar3 == uVar4) {
    if (((env->cp15).mdscr_el1 & 0x2000) == 0) {
      return false;
    }
    return (env->daif & 0x200) == 0;
  }
  return uVar3 < uVar4;
}

Assistant:

static inline bool aa64_generate_debug_exceptions(CPUARMState *env)
{
    int cur_el = arm_current_el(env);
    int debug_el;

    if (cur_el == 3) {
        return false;
    }

    /* MDCR_EL3.SDD disables debug events from Secure state */
    if (arm_is_secure_below_el3(env)
        && extract32(env->cp15.mdcr_el3, 16, 1)) {
        return false;
    }

    /*
     * Same EL to same EL debug exceptions need MDSCR_KDE enabled
     * while not masking the (D)ebug bit in DAIF.
     */
    debug_el = arm_debug_target_el(env);

    if (cur_el == debug_el) {
        return extract32(env->cp15.mdscr_el1, 13, 1)
            && !(env->daif & PSTATE_D);
    }

    /* Otherwise the debug target needs to be a higher EL */
    return debug_el > cur_el;
}